

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_dev.cpp
# Opt level: O2

TrackData * __thiscall
BlockFloppyDisk::load
          (TrackData *__return_storage_ptr__,BlockFloppyDisk *this,CylHead *cylhead,bool param_2)

{
  pointer pSVar1;
  uint8_t *puVar2;
  pointer piVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  posix_error *this_00;
  int *piVar7;
  long sector;
  int i;
  long lVar8;
  pointer piVar9;
  Sector *s;
  pointer this_01;
  allocator_type local_b1;
  CylHead *local_b0;
  Format *local_a8;
  Track track;
  MEMORY mem;
  vector<int,_std::allocator<int>_> error_ids;
  Data data;
  
  sector = (long)(this->super_DemandDisk).super_Disk.fmt.sectors *
           ((long)cylhead->head +
           (long)(this->super_DemandDisk).super_Disk.fmt.heads * (long)cylhead->cyl);
  error_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  error_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  error_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b0 = cylhead;
  bVar4 = HDD::Seek((this->m_blockdev)._M_t.super___uniq_ptr_impl<HDD,_std::default_delete<HDD>_>.
                    _M_t.super__Tuple_impl<0UL,_HDD_*,_std::default_delete<HDD>_>.
                    super__Head_base<0UL,_HDD_*,_false>._M_head_impl,sector);
  if (!bVar4) {
    this_00 = (posix_error *)__cxa_allocate_exception(0x20);
    piVar7 = __errno_location();
    posix_error::posix_error(this_00,*piVar7,"seek");
    __cxa_throw(this_00,&posix_error::typeinfo,std::system_error::~system_error);
  }
  local_a8 = &(this->super_DemandDisk).super_Disk.fmt;
  mem.size = Format::track_size(local_a8);
  mem._vptr_MEMORY = (_func_int **)&PTR__MEMORY_001dcd38;
  mem.pb = AllocMem(mem.size);
  iVar5 = HDD::Read((this->m_blockdev)._M_t.super___uniq_ptr_impl<HDD,_std::default_delete<HDD>_>.
                    _M_t.super__Tuple_impl<0UL,_HDD_*,_std::default_delete<HDD>_>.
                    super__Head_base<0UL,_HDD_*,_false>._M_head_impl,mem.pb,
                    (this->super_DemandDisk).super_Disk.fmt.sectors,false);
  iVar6 = (this->super_DemandDisk).super_Disk.fmt.sectors;
  if (iVar5 < iVar6) {
    for (lVar8 = 0; puVar2 = mem.pb, lVar8 < iVar6; lVar8 = lVar8 + 1) {
      iVar6 = Format::sector_size(local_a8);
      bVar4 = HDD::Seek((this->m_blockdev)._M_t.
                        super___uniq_ptr_impl<HDD,_std::default_delete<HDD>_>._M_t.
                        super__Tuple_impl<0UL,_HDD_*,_std::default_delete<HDD>_>.
                        super__Head_base<0UL,_HDD_*,_false>._M_head_impl,sector + lVar8);
      if (bVar4) {
        iVar6 = HDD::Read((this->m_blockdev)._M_t.
                          super___uniq_ptr_impl<HDD,_std::default_delete<HDD>_>._M_t.
                          super__Tuple_impl<0UL,_HDD_*,_std::default_delete<HDD>_>.
                          super__Head_base<0UL,_HDD_*,_false>._M_head_impl,puVar2 + iVar6 * lVar8,1,
                          false);
        if (iVar6 == 0) goto LAB_0017f934;
      }
      else {
LAB_0017f934:
        track._0_8_ = CHR(local_b0->cyl,local_b0->head,
                          (this->super_DemandDisk).super_Disk.fmt.base + (int)lVar8);
        Message<char_const*>(msgWarning,"error reading %s",(char **)&track);
        track.tracklen = (this->super_DemandDisk).super_Disk.fmt.base + (int)lVar8;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&error_ids,&track.tracklen);
      }
      iVar6 = (this->super_DemandDisk).super_Disk.fmt.sectors;
    }
  }
  Track::Track(&track,0);
  Track::format(&track,local_b0,local_a8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&data,mem.pb,mem.pb + mem.size,
             &local_b1);
  Track::populate(&track,(const_iterator)
                         data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                  (const_iterator)
                  data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  piVar3 = error_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar9 = error_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar1 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
               super__Vector_impl_data._M_finish, piVar9 != piVar3; piVar9 = piVar9 + 1) {
    iVar6 = *piVar9;
    for (this_01 = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                   super__Vector_impl_data._M_start; this_01 != pSVar1; this_01 = this_01 + 1) {
      if ((this_01->header).sector == iVar6) {
        Sector::set_baddatacrc(this_01,true);
      }
    }
  }
  TrackData::TrackData(__return_storage_ptr__,local_b0,&track);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  std::vector<Sector,_std::allocator<Sector>_>::~vector(&track.m_sectors);
  MEMORY::~MEMORY(&mem);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&error_ids.super__Vector_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

TrackData load(const CylHead& cylhead, bool /*first_read*/) override
    {
        auto lba = (cylhead.cyl * fmt.heads + cylhead.head) * fmt.sectors;
        std::vector<int> error_ids;

        if (!m_blockdev->Seek(lba))
            throw posix_error(errno, "seek");

        MEMORY mem(fmt.track_size());
        if (m_blockdev->Read(mem.pb, fmt.sectors) < fmt.sectors)
        {
            // Retry sectors individually
            for (auto i = 0; i < fmt.sectors; ++i)
            {
                auto p = mem.pb + i * fmt.sector_size();
                if (!m_blockdev->Seek(lba + i) || !m_blockdev->Read(p, 1))
                {
                    Message(msgWarning, "error reading %s",
                        CHR(cylhead.cyl, cylhead.head, fmt.base + i));
                    error_ids.push_back(fmt.base + i);
                }
            }
        }

        Track track;
        track.format(cylhead, fmt);

        Data data(mem.pb, mem.pb + mem.size);
        track.populate(data.begin(), data.end());

        // Flag any errors
        for (auto id : error_ids)
        {
            for (auto& s : track)
                if (s.header.sector == id)
                    s.set_baddatacrc();
        }

        return TrackData(cylhead, std::move(track));
    }